

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O3

void __thiscall bandit::detail::spec_reporter::it_starting(spec_reporter *this,char *desc)

{
  int *piVar1;
  ostream *poVar2;
  size_t sVar3;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  piVar1 = &(this->super_progress_reporter).specs_run_;
  *piVar1 = *piVar1 + 1;
  poVar2 = this->stm_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"- it ",5);
  if (desc == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(desc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,desc,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ... ",5);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_starting(const char* desc)
    {
      progress_reporter::it_starting(desc);
      stm_ << indent() << "- it " << desc << " ... ";
      stm_.flush();
    }